

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

UBool __thiscall icu_63::LocalizationInfo::operator==(LocalizationInfo *this,LocalizationInfo *rhs)

{
  UBool UVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar8;
  int j;
  int iVar9;
  ulong uVar10;
  
  if (rhs != (LocalizationInfo *)0x0) {
    if (this == rhs) {
      uVar10 = 1;
      goto LAB_00224fed;
    }
    uVar2 = (*this->_vptr_LocalizationInfo[3])(this);
    uVar3 = (*rhs->_vptr_LocalizationInfo[3])(rhs);
    uVar10 = 0;
    if (uVar2 != uVar3) goto LAB_00224fed;
    uVar8 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar8 = uVar10;
    }
    do {
      if ((uint)uVar8 == (uint)uVar10) {
        iVar4 = (*this->_vptr_LocalizationInfo[5])(this);
        iVar5 = (*rhs->_vptr_LocalizationInfo[5])(rhs);
        uVar10 = 0;
        if (iVar4 != iVar5) goto LAB_00224fed;
        iVar5 = 0;
        if (0 < iVar4) {
          iVar5 = iVar4;
        }
        goto LAB_0022502b;
      }
      iVar4 = (*this->_vptr_LocalizationInfo[4])(this,uVar10);
      iVar5 = (*rhs->_vptr_LocalizationInfo[4])(rhs,uVar10);
      UVar1 = streq((UChar *)CONCAT44(extraout_var,iVar4),(UChar *)CONCAT44(extraout_var_00,iVar5));
      uVar10 = (ulong)((uint)uVar10 + 1);
    } while (UVar1 != '\0');
  }
  uVar10 = 0;
LAB_00224fed:
  return (UBool)uVar10;
LAB_0022502b:
  iVar9 = (int)uVar10;
  if (iVar9 == iVar5) goto LAB_002250b7;
  iVar6 = (*this->_vptr_LocalizationInfo[6])(this,uVar10);
  uVar2 = (*rhs->_vptr_LocalizationInfo[8])(rhs,(UChar *)CONCAT44(extraout_var_01,iVar6));
  iVar7 = (*rhs->_vptr_LocalizationInfo[6])(rhs);
  UVar1 = streq((UChar *)CONCAT44(extraout_var_01,iVar6),(UChar *)CONCAT44(extraout_var_02,iVar7));
  if (UVar1 == '\0') goto LAB_002250b7;
  uVar3 = 0;
  while ((uint)uVar8 != uVar3) {
    iVar6 = (*this->_vptr_LocalizationInfo[7])(this,uVar10,(ulong)uVar3);
    iVar7 = (*rhs->_vptr_LocalizationInfo[7])(rhs,(ulong)uVar2,(ulong)uVar3);
    UVar1 = streq((UChar *)CONCAT44(extraout_var_03,iVar6),(UChar *)CONCAT44(extraout_var_04,iVar7))
    ;
    uVar3 = uVar3 + 1;
    if (UVar1 == '\0') goto LAB_002250b7;
  }
  uVar10 = (ulong)(iVar9 + 1);
  goto LAB_0022502b;
LAB_002250b7:
  uVar10 = (ulong)(iVar4 <= iVar9);
  goto LAB_00224fed;
}

Assistant:

UBool
LocalizationInfo::operator==(const LocalizationInfo* rhs) const {
    if (rhs) {
        if (this == rhs) {
            return TRUE;
        }
        
        int32_t rsc = getNumberOfRuleSets();
        if (rsc == rhs->getNumberOfRuleSets()) {
            for (int i = 0; i < rsc; ++i) {
                if (!streq(getRuleSetName(i), rhs->getRuleSetName(i))) {
                    return FALSE;
                }
            }
            int32_t dlc = getNumberOfDisplayLocales();
            if (dlc == rhs->getNumberOfDisplayLocales()) {
                for (int i = 0; i < dlc; ++i) {
                    const UChar* locale = getLocaleName(i);
                    int32_t ix = rhs->indexForLocale(locale);
                    // if no locale, ix is -1, getLocaleName returns null, so streq returns false
                    if (!streq(locale, rhs->getLocaleName(ix))) {
                        return FALSE;
                    }
                    for (int j = 0; j < rsc; ++j) {
                        if (!streq(getDisplayName(i, j), rhs->getDisplayName(ix, j))) {
                            return FALSE;
                        }
                    }
                }
                return TRUE;
            }
        }
    }
    return FALSE;
}